

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpatch.hpp
# Opt level: O1

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpatch::detail::
from_diff<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
          (detail *this,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *source,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *target,
          string_view_type *path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val_00;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *pkVar1;
  pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
  *__return_storage_ptr__;
  bool bVar2;
  undefined1 uVar3;
  undefined8 uVar4;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this_00;
  bool bVar5;
  int iVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar10;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *target_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_04;
  byte bVar12;
  undefined1 s [8];
  unsigned_long value;
  array_range_type aVar13;
  array_range_type aVar14;
  array_range_type aVar15;
  const_object_iterator cVar16;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> bVar17;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> temp_diff;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> temp_diff_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ss;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> val_4;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> val_2;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> val;
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
  local_d8;
  undefined1 local_c8 [8];
  undefined1 local_c0 [8];
  undefined1 auStack_b8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
  local_80;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
  local_70;
  string_view_type *local_58;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *local_50;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_48;
  string_view_type local_40;
  
  local_c0 = (undefined1  [8])0x0;
  auStack_b8._0_8_ = (pointer)0x0;
  auStack_b8._8_8_ = (pointer)0x0;
  local_58 = path;
  pvVar7 = operator_new(0x20);
  *(undefined1 (*) [8])((long)pvVar7 + 8) = local_c0;
  *(undefined8 *)((long)pvVar7 + 0x10) = auStack_b8._0_8_;
  *(undefined8 *)((long)pvVar7 + 0x18) = auStack_b8._8_8_;
  local_c0 = (undefined1  [8])0x0;
  auStack_b8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  auStack_b8._8_8_ = (pointer)0x0;
  *(undefined2 *)this = 0xe;
  *(void **)(this + 8) = pvVar7;
  json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
  ::flatten_and_destroy
            ((json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
              *)local_c8);
  std::
  vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
  ::~vector((vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
             *)(local_c8 + 8));
  auStack_b8._16_8_ = target;
  iVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::compare
                    (source,target);
  pbVar11 = extraout_RDX;
  if (iVar6 != 0) {
    bVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                      (source);
    uVar4 = auStack_b8._16_8_;
    local_50 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)source;
    if ((bVar5) &&
       (bVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                          ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)auStack_b8._16_8_), bVar5)) {
      sVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                        (source);
      sVar9 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                        ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)uVar4);
      if (sVar9 < sVar8) {
        sVar8 = sVar9;
      }
      if (sVar8 != 0) {
        value = 0;
        do {
          local_c8 = (undefined1  [8])(local_c0 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c8,local_58->_M_str,local_58->_M_str + local_58->_M_len);
          std::__cxx11::string::push_back
                    ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c8);
          jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
                    (value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c8);
          pbVar10 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                *)local_50,value);
          target_00 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                  *)auStack_b8._16_8_,value);
          local_e8._M_allocated_capacity = (size_type)local_c0;
          local_e8._8_8_ = local_c8;
          from_diff<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                    ((detail *)local_108,pbVar10,target_00,(string_view_type *)&local_e8);
          aVar13 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                   array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                *)this);
          aVar14 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                   array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                *)local_108);
          aVar15 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                   array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                *)local_108);
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          insert<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>*,std::vector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                    ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this
                     ,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                      aVar13.last_._M_current,
                     (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     aVar14.first_._M_current,
                     (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     aVar15.last_._M_current);
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     local_108);
          if (local_c8 != (undefined1  [8])(local_c0 + 8)) {
            operator_delete((void *)local_c8,(ulong)(auStack_b8._0_8_ + 1));
          }
          value = value + 1;
        } while (sVar8 != value);
      }
      sVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                        ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)local_50);
      while (sVar9 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     size((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                           *)auStack_b8._16_8_), sVar9 < sVar8) {
        local_c8 = (undefined1  [8])(local_c0 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c8,local_58->_M_str,local_58->_M_str + local_58->_M_len);
        std::__cxx11::string::push_back
                  ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8);
        sVar8 = sVar8 - 1;
        jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
                  (sVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8);
        local_70.long_str_.ptr_ = (pointer)operator_new(0x20);
        *(undefined8 *)((long)local_70.long_str_.ptr_ + 8) = 0;
        *(undefined8 *)((long)local_70.long_str_.ptr_ + 0x10) = 0;
        *(undefined8 *)((long)local_70.byte_str_.ptr_ + 0x18) = 0;
        local_70.common_ = (common_storage)0xd;
        jsonpatch_names<char>::op_name_abi_cxx11_();
        local_80._0_8_ = local_108._8_8_;
        local_80.long_str_.ptr_ = (pointer)local_108._0_8_;
        jsonpatch_names<char>::remove_name_abi_cxx11_();
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<std::__cxx11::string>
                  ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                    *)(auStack_b8 + 0x18),
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   &local_70.common_,(string_view_type *)&local_80.common_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8);
        if ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
             *)local_e8._M_allocated_capacity != &local_d8) {
          operator_delete((void *)local_e8._M_allocated_capacity,(ulong)(local_d8._0_8_ + 1));
        }
        if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)local_108._0_8_ !=
            (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        }
        jsonpatch_names<char>::path_name_abi_cxx11_();
        local_a0._M_dataplus._M_p = (pointer)local_108._8_8_;
        local_a0._M_string_length = local_108._0_8_;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<std::__cxx11::string&>
                  ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                    *)&local_e8,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   &local_70.common_,(string_view_type *)(auStack_b8 + 0x18),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
        if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)local_108._0_8_ !=
            (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        }
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                         *)&local_70.common_);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   &local_70.common_);
        if (local_c8 != (undefined1  [8])(local_c0 + 8)) {
          operator_delete((void *)local_c8,(ulong)(auStack_b8._0_8_ + 1));
        }
      }
      sVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                        ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)local_50);
      __return_storage_ptr__ =
           (pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
            *)(auStack_b8 + 0x18);
      for (; sVar9 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     size((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                           *)auStack_b8._16_8_), pbVar11 = extraout_RDX_04, sVar8 < sVar9;
          sVar8 = sVar8 + 1) {
        pbVar10 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                              *)auStack_b8._16_8_,sVar8);
        local_c8 = (undefined1  [8])(local_c0 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c8,local_58->_M_str,local_58->_M_str + local_58->_M_len);
        std::__cxx11::string::push_back
                  ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8);
        jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
                  (sVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8);
        local_70.long_str_.ptr_ = (pointer)operator_new(0x20);
        *(undefined8 *)((long)local_70.long_str_.ptr_ + 8) = 0;
        *(undefined8 *)((long)local_70.long_str_.ptr_ + 0x10) = 0;
        *(undefined8 *)((long)local_70.byte_str_.ptr_ + 0x18) = 0;
        local_70.common_ = (common_storage)0xd;
        jsonpatch_names<char>::op_name_abi_cxx11_();
        local_80._0_8_ = local_108._8_8_;
        local_80.long_str_.ptr_ = (pointer)local_108._0_8_;
        jsonpatch_names<char>::add_name_abi_cxx11_();
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<std::__cxx11::string>
                  (__return_storage_ptr__,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   &local_70.common_,(string_view_type *)&local_80.common_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8);
        if ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
             *)local_e8._M_allocated_capacity != &local_d8) {
          operator_delete((void *)local_e8._M_allocated_capacity,(ulong)(local_d8._0_8_ + 1));
        }
        if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)local_108._0_8_ !=
            (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        }
        jsonpatch_names<char>::path_name_abi_cxx11_();
        local_a0._M_dataplus._M_p = (pointer)local_108._8_8_;
        local_a0._M_string_length = local_108._0_8_;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<std::__cxx11::string&>
                  ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                    *)&local_e8,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   &local_70.common_,(string_view_type *)__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
        if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)local_108._0_8_ !=
            (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        }
        jsonpatch_names<char>::value_name_abi_cxx11_();
        local_a0._M_dataplus._M_p = (pointer)local_108._8_8_;
        local_a0._M_string_length = local_108._0_8_;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&>
                  ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                    *)&local_e8,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   &local_70.common_,(string_view_type *)__return_storage_ptr__,pbVar10);
        if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)local_108._0_8_ !=
            (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        }
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                         *)&local_70.common_);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   &local_70.common_);
        if (local_c8 != (undefined1  [8])(local_c0 + 8)) {
          operator_delete((void *)local_c8,(ulong)(auStack_b8._0_8_ + 1));
        }
      }
    }
    else {
      bVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                        (source);
      if ((bVar5) &&
         (bVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                  is_object((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)uVar4), bVar5)) {
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        object_range_abi_cxx11_
                  ((const_object_range_type *)local_c8,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)source
                  );
        uVar4 = auStack_b8._16_8_;
        bVar2 = local_c0[0];
        uVar3 = auStack_b8[8];
        bVar12 = local_c0[0] & auStack_b8[8];
        local_48 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *)auStack_b8._0_8_;
        bVar5 = local_c0[0] == (bool)auStack_b8[8];
        if ((bVar12 & 1) != 0) {
          bVar5 = local_c8 == (undefined1  [8])auStack_b8._0_8_;
        }
        if (!bVar5) {
          s = local_c8;
          do {
            local_108._0_8_ = local_108 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_108,local_58->_M_str,local_58->_M_str + local_58->_M_len);
            std::__cxx11::string::push_back
                      ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108);
            jsonpointer::escape<std::__cxx11::string,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108);
            local_e8._8_8_ =
                 (((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *)s)->key_)._M_dataplus._M_p;
            local_e8._M_allocated_capacity =
                 (((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *)s)->key_)._M_string_length;
            cVar16 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                     find_abi_cxx11_((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                      *)uVar4,(string_view_type *)&local_e8);
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            object_range_abi_cxx11_
                      ((const_object_range_type *)&local_e8,
                       (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       uVar4);
            if ((((undefined1  [16])cVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
               ((local_d8.short_str_.data_[6] & 1U) == 0)) {
              bVar5 = cVar16.has_value_ == (bool)local_d8.short_str_.data_[6];
            }
            else {
              bVar5 = cVar16.it_._M_current._M_current ==
                      (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       *)local_d8._0_8_;
            }
            if (bVar5) {
              local_80.long_str_.ptr_ = (pointer)operator_new(0x20);
              *(undefined8 *)
               &(((pointer)local_80.long_str_.ptr_)->
                super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8 = 0;
              ((pointer)local_80.long_str_.ptr_)->p_ = (pointer)0x0;
              (local_80.byte_str_.ptr_)->length_ = 0;
              local_80.common_ = (common_storage)0xd;
              jsonpatch_names<char>::op_name_abi_cxx11_();
              local_40._M_len = local_e8._8_8_;
              local_40._M_str = (char *)local_e8._M_allocated_capacity;
              jsonpatch_names<char>::remove_name_abi_cxx11_();
              basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
              insert_or_assign<std::__cxx11::string>
                        ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                          *)&local_70.common_,
                         (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                         &local_80.common_,&local_40,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (auStack_b8 + 0x18));
              if (local_a0._M_dataplus._M_p != auStack_b8 + 0x28) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
                   *)local_e8._M_allocated_capacity != &local_d8) {
                operator_delete((void *)local_e8._M_allocated_capacity,(ulong)(local_d8._0_8_ + 1));
              }
              jsonpatch_names<char>::path_name_abi_cxx11_();
              local_70._0_8_ = local_e8._8_8_;
              local_70.long_str_.ptr_ = (pointer)local_e8._M_allocated_capacity;
              basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
              insert_or_assign<std::__cxx11::string&>
                        ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                          *)(auStack_b8 + 0x18),
                         (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                         &local_80.common_,(string_view_type *)&local_70.common_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108);
              if ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
                   *)local_e8._M_allocated_capacity != &local_d8) {
                operator_delete((void *)local_e8._M_allocated_capacity,(ulong)(local_d8._0_8_ + 1));
              }
              basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                        ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                  *)&local_80.common_);
              basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                        ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)&local_80.common_);
            }
            else {
              local_a0._M_dataplus._M_p = (pointer)local_108._8_8_;
              local_a0._M_string_length = local_108._0_8_;
              from_diff<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                        ((detail *)local_e8._M_local_buf,
                         &((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                            *)s)->value_,&(cVar16.it_._M_current._M_current)->value_,
                         (string_view_type *)(auStack_b8 + 0x18));
              aVar13 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                       array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                    *)this);
              aVar14 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                       array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                    *)&local_e8);
              aVar15 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                       array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                    *)&local_e8);
              basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
              insert<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>*,std::vector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                        ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                         this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                               *)aVar13.last_._M_current,
                         (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)aVar14.first_._M_current,
                         (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)aVar15.last_._M_current);
              basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                        ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)&local_e8);
            }
            if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *)local_108._0_8_ !=
                (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *)(local_108 + 0x10)) {
              operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
            }
            s = (undefined1  [8])((long)s + 0x30);
            bVar5 = s == (undefined1  [8])local_48;
            if ((bVar12 & 1) == 0) {
              bVar5 = bVar2 == (bool)uVar3;
            }
          } while (!bVar5);
        }
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        object_range_abi_cxx11_
                  ((const_object_range_type *)local_c8,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   auStack_b8._16_8_);
        this_00 = local_50;
        bVar2 = local_c0[0];
        uVar3 = auStack_b8[8];
        bVar12 = local_c0[0] & auStack_b8[8];
        local_48 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *)auStack_b8._0_8_;
        bVar5 = local_c0[0] == (bool)auStack_b8[8];
        if ((bVar12 & 1) != 0) {
          bVar5 = local_c8 == (undefined1  [8])auStack_b8._0_8_;
        }
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  auStack_b8._0_8_;
        if (!bVar5) {
          val_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (auStack_b8 + 0x18);
          do {
            local_108._8_8_ =
                 (((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *)local_c8)->key_)._M_dataplus._M_p;
            local_108._0_8_ =
                 (((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *)local_c8)->key_)._M_string_length;
            auStack_b8._16_8_ = local_c8;
            cVar16 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                     find_abi_cxx11_(this_00,(string_view_type *)local_108);
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            object_range_abi_cxx11_((const_object_range_type *)local_108,this_00);
            if ((((undefined1  [16])cVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
               ((local_108[0x18] & 1) == 0)) {
              bVar5 = cVar16.has_value_ == (bool)local_108[0x18];
            }
            else {
              bVar5 = cVar16.it_._M_current._M_current ==
                      (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       *)local_108._16_8_;
            }
            pbVar11 = extraout_RDX_00;
            if (bVar5) {
              local_108._0_8_ = local_108 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_108,local_58->_M_str,local_58->_M_str + local_58->_M_len);
              std::__cxx11::string::push_back
                        ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_108);
              jsonpointer::escape<std::__cxx11::string,std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_b8._16_8_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108);
              local_80.long_str_.ptr_ = (pointer)operator_new(0x20);
              *(undefined8 *)
               &(((pointer)local_80.long_str_.ptr_)->
                super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8 = 0;
              ((pointer)local_80.long_str_.ptr_)->p_ = (pointer)0x0;
              (local_80.byte_str_.ptr_)->length_ = 0;
              local_80.common_ = (common_storage)0xd;
              jsonpatch_names<char>::op_name_abi_cxx11_();
              local_40._M_len = local_e8._8_8_;
              local_40._M_str = (char *)local_e8._M_allocated_capacity;
              jsonpatch_names<char>::add_name_abi_cxx11_();
              basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
              insert_or_assign<std::__cxx11::string>
                        ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                          *)&local_70.common_,
                         (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                         &local_80.common_,&local_40,val_00);
              if (local_a0._M_dataplus._M_p != auStack_b8 + 0x28) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
                   *)local_e8._M_allocated_capacity != &local_d8) {
                operator_delete((void *)local_e8._M_allocated_capacity,(ulong)(local_d8._0_8_ + 1));
              }
              jsonpatch_names<char>::path_name_abi_cxx11_();
              local_70._0_8_ = local_e8._8_8_;
              local_70.long_str_.ptr_ = (pointer)local_e8._M_allocated_capacity;
              basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
              insert_or_assign<std::__cxx11::string&>
                        ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                          *)val_00,
                         (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                         &local_80.common_,(string_view_type *)&local_70.common_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108);
              if ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
                   *)local_e8._M_allocated_capacity != &local_d8) {
                operator_delete((void *)local_e8._M_allocated_capacity,(ulong)(local_d8._0_8_ + 1));
              }
              jsonpatch_names<char>::value_name_abi_cxx11_();
              local_70._0_8_ = local_e8._8_8_;
              local_70.long_str_.ptr_ = (pointer)local_e8._M_allocated_capacity;
              basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
              insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&>
                        ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                          *)val_00,
                         (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                         &local_80.common_,(string_view_type *)&local_70.common_,
                         (value_type *)(auStack_b8._16_8_ + 0x20));
              if ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
                   *)local_e8._M_allocated_capacity != &local_d8) {
                operator_delete((void *)local_e8._M_allocated_capacity,(ulong)(local_d8._0_8_ + 1));
              }
              basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                        ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                  *)&local_80.common_);
              basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                        ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)&local_80.common_);
              pbVar11 = extraout_RDX_01;
              if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   *)local_108._0_8_ !=
                  (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   *)(local_108 + 0x10)) {
                operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
                pbVar11 = extraout_RDX_02;
              }
            }
            local_c8 = (undefined1  [8])(auStack_b8._16_8_ + 0x30);
            bVar5 = local_c8 == (undefined1  [8])local_48;
            if ((bVar12 & 1) == 0) {
              bVar5 = bVar2 == (bool)uVar3;
            }
          } while (!bVar5);
        }
      }
      else {
        local_a0._M_string_length = (size_type)operator_new(0x20);
        *(undefined8 *)(local_a0._M_string_length + 8) = 0;
        *(undefined8 *)(local_a0._M_string_length + 0x10) = 0;
        *(undefined8 *)(local_a0._M_string_length + 0x18) = 0;
        local_a0._M_dataplus._M_p._0_2_ = 0xd;
        jsonpatch_names<char>::op_name_abi_cxx11_();
        local_70._0_8_ = local_c0;
        local_70.long_str_.ptr_ = (pointer)local_c8;
        jsonpatch_names<char>::replace_name_abi_cxx11_();
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<std::__cxx11::string>
                  ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                    *)&local_e8,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   (auStack_b8 + 0x18),(string_view_type *)&local_70.common_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
        if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)local_108._0_8_ !=
            (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        }
        pkVar1 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)(local_c0 + 8);
        if (local_c8 != (undefined1  [8])pkVar1) {
          operator_delete((void *)local_c8,(ulong)(auStack_b8._0_8_ + 1));
        }
        jsonpatch_names<char>::path_name_abi_cxx11_();
        local_e8._M_allocated_capacity = (size_type)local_c0;
        local_e8._8_8_ = local_c8;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                    *)local_108,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   (auStack_b8 + 0x18),(string_view_type *)&local_e8,local_58);
        if (local_c8 != (undefined1  [8])pkVar1) {
          operator_delete((void *)local_c8,(ulong)(auStack_b8._0_8_ + 1));
        }
        jsonpatch_names<char>::value_name_abi_cxx11_();
        local_e8._M_allocated_capacity = (size_type)local_c0;
        local_e8._8_8_ = local_c8;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&>
                  ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                    *)local_108,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   (auStack_b8 + 0x18),(string_view_type *)&local_e8,
                   (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   uVar4);
        if (local_c8 != (undefined1  [8])pkVar1) {
          operator_delete((void *)local_c8,(ulong)(auStack_b8._0_8_ + 1));
        }
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                         *)(auStack_b8 + 0x18));
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   (auStack_b8 + 0x18));
        pbVar11 = extraout_RDX_03;
      }
    }
  }
  bVar17.field_0.int64_.val_ = (int64_t)pbVar11;
  bVar17.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>)bVar17.field_0;
}

Assistant:

Json from_diff(const Json& source, const Json& target, const typename Json::string_view_type& path)
    {
        using char_type = typename Json::char_type;

        Json result = typename Json::array();

        if (source == target)
        {
            return result;
        }

        if (source.is_array() && target.is_array())
        {
            std::size_t common = (std::min)(source.size(),target.size());
            for (std::size_t i = 0; i < common; ++i)
            {
                std::basic_string<char_type> ss(path); 
                ss.push_back('/');
                jsoncons::detail::from_integer(i,ss);
                auto temp_diff = from_diff(source[i],target[i],ss);
                result.insert(result.array_range().end(),temp_diff.array_range().begin(),temp_diff.array_range().end());
            }
            // Element in source, not in target - remove
            for (std::size_t i = source.size(); i-- > target.size();)
            {
                std::basic_string<char_type> ss(path); 
                ss.push_back('/');
                jsoncons::detail::from_integer(i,ss);
                Json val(json_object_arg);
                val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::remove_name());
                val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                result.push_back(std::move(val));
            }
            // Element in target, not in source - add, 
            // Fix contributed by Alexander rog13
            for (std::size_t i = source.size(); i < target.size(); ++i)
            {
                const auto& a = target[i];
                std::basic_string<char_type> ss(path); 
                ss.push_back('/');
                jsoncons::detail::from_integer(i,ss);
                Json val(json_object_arg);
                val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::add_name());
                val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                val.insert_or_assign(jsonpatch_names<char_type>::value_name(), a);
                result.push_back(std::move(val));
            }
        }
        else if (source.is_object() && target.is_object())
        {
            for (const auto& a : source.object_range())
            {
                std::basic_string<char_type> ss(path);
                ss.push_back('/'); 
                jsonpointer::escape(a.key(),ss);
                auto it = target.find(a.key());
                if (it != target.object_range().end())
                {
                    auto temp_diff = from_diff(a.value(),(*it).value(),ss);
                    result.insert(result.array_range().end(),temp_diff.array_range().begin(),temp_diff.array_range().end());
                }
                else
                {
                    Json val(json_object_arg);
                    val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::remove_name());
                    val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                    result.push_back(std::move(val));
                }
            }
            for (const auto& a : target.object_range())
            {
                auto it = source.find(a.key());
                if (it == source.object_range().end())
                {
                    std::basic_string<char_type> ss(path); 
                    ss.push_back('/');
                    jsonpointer::escape(a.key(),ss);
                    Json val(json_object_arg);
                    val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::add_name());
                    val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                    val.insert_or_assign(jsonpatch_names<char_type>::value_name(), a.value());
                    result.push_back(std::move(val));
                }
            }
        }
        else
        {
            Json val(json_object_arg);
            val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::replace_name());
            val.insert_or_assign(jsonpatch_names<char_type>::path_name(), path);
            val.insert_or_assign(jsonpatch_names<char_type>::value_name(), target);
            result.push_back(std::move(val));
        }

        return result;
    }